

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.h
# Opt level: O0

Index anurbs::Math::binom(Index n,Index k)

{
  Index IVar1;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  Index k_local;
  Index n_local;
  
  if (n < k) {
    local_20 = 0;
  }
  else {
    if ((k == 0) || (k == n)) {
      local_28 = 1;
    }
    else {
      local_30 = n;
      if ((k != 1) && (k != n + -1)) {
        if (k * 2 < n) {
          IVar1 = binom(n + -1,k + -1);
          local_38 = (IVar1 * n) / k;
        }
        else {
          IVar1 = binom(n + -1,k);
          local_38 = (IVar1 * n) / (n - k);
        }
        local_30 = local_38;
      }
      local_28 = local_30;
    }
    local_20 = local_28;
  }
  return local_20;
}

Assistant:

constexpr inline Index binom(const Index n, const Index k) noexcept
{
    // clang-format off
    return (k > n               ) ? 0           :  // out of range
           (k == 0 || k == n    ) ? 1           :  // edge
           (k == 1 || k == n - 1) ? n           :  // first
           (k + k < n           ) ?                // recursive:
           (binom(n - 1, k - 1  ) * n) / k      :  //   path to k = 1     faster
           (binom(n - 1, k      ) * n) / (n - k);  //   path to k = n - 1 faster
    // clang-format on
}